

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::MergePartialFromCodedStream
          (CustomModel_CustomModelParamValue *this,CodedInputStream *input)

{
  ValueUnion *this_00;
  byte *pbVar1;
  byte bVar2;
  uint8 uVar3;
  byte *pbVar4;
  uint64 *puVar5;
  uint8 *puVar6;
  bool bVar7;
  uint uVar8;
  uint32 uVar9;
  uint64 in_RAX;
  undefined8 *puVar10;
  int iVar11;
  char cVar12;
  ulong uVar13;
  int iVar14;
  pair<unsigned_long,_bool> pVar15;
  pair<unsigned_long,_bool> pVar16;
  uint64 local_38;
  
  this_00 = &this->value_;
  local_38 = in_RAX;
  do {
    pbVar4 = input->buffer_;
    uVar9 = 0;
    if (pbVar4 < input->buffer_end_) {
      bVar2 = *pbVar4;
      uVar13 = (ulong)bVar2;
      pbVar1 = pbVar4 + 1;
      uVar8 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar9 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar9 = uVar8, (~(uint)*pbVar1 & uVar8) < 0x80))
        goto LAB_003cdf16;
        uVar13 = (ulong)((uVar8 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar4 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar13 = uVar13 | 0x100000000;
    }
    else {
LAB_003cdf16:
      uVar9 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar9);
      uVar13 = 0;
      if (uVar9 - 1 < 0x3fff) {
        uVar13 = 0x100000000;
      }
      uVar13 = uVar9 | uVar13;
    }
    uVar9 = (uint32)uVar13;
    iVar14 = 6;
    iVar11 = iVar14;
    if ((uVar13 & 0x100000000) == 0) {
LAB_003cdc9a:
      iVar11 = 7;
      if ((uVar9 & 7) != 4 && uVar9 != 0) {
        bVar7 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar9);
        goto LAB_003cdcb9;
      }
    }
    else {
      uVar8 = (uint)(uVar13 >> 3) & 0x1fffffff;
      cVar12 = (char)uVar13;
      if (uVar8 == 0x3c) {
        if (cVar12 != -0x1e) goto LAB_003cdc9a;
        if (this->_oneof_case_[0] != 0x3c) {
          clear_value(this);
          this->_oneof_case_[0] = 0x3c;
          this->value_ = (ValueUnion)
                         &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
        }
        if ((undefined8 *)this_00->longvalue_ ==
            &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (&this_00->stringvalue_,
                     (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar7 = google::protobuf::internal::WireFormatLite::ReadBytes
                          (input,((string *)*(ArenaStringPtr *)this_00).ptr_);
LAB_003cdcb9:
        iVar11 = iVar14;
        if (bVar7 == false) goto LAB_003cdcc2;
      }
      else {
        if (uVar8 == 0x14) {
          if (cVar12 != -0x5e) goto LAB_003cdc9a;
          if (this->_oneof_case_[0] != 0x14) {
            clear_value(this);
            this->_oneof_case_[0] = 0x14;
            this->value_ = (ValueUnion)
                           &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
          }
          if ((undefined8 *)this_00->longvalue_ ==
              &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
            google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                      (&this_00->stringvalue_,
                       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
            ;
          }
          bVar7 = google::protobuf::internal::WireFormatLite::ReadBytes
                            (input,((string *)*(ArenaStringPtr *)this_00).ptr_);
          if (!bVar7) goto LAB_003cdcc2;
          puVar10 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
          if (this->_oneof_case_[0] == 0x14) {
            puVar10 = (undefined8 *)(this->value_).longvalue_;
          }
          bVar7 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                            ((char *)*puVar10,*(int *)(puVar10 + 1),PARSE,
                             "CoreML.Specification.CustomModel.CustomModelParamValue.stringValue");
          goto LAB_003cdcb9;
        }
        if (uVar8 == 0x1e) {
          if (cVar12 != -0x10) goto LAB_003cdc9a;
          clear_value(this);
          pbVar4 = input->buffer_;
          if (pbVar4 < input->buffer_end_) {
            bVar2 = *pbVar4;
            uVar13 = (ulong)bVar2;
            uVar9 = (uint32)bVar2;
            if ((char)bVar2 < '\0') goto LAB_003cdf3c;
            input->buffer_ = pbVar4 + 1;
            bVar7 = true;
          }
          else {
            uVar9 = 0;
LAB_003cdf3c:
            uVar13 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
            bVar7 = -1 < (long)uVar13;
          }
          if (!bVar7) goto LAB_003cdcc2;
          (this->value_).intvalue_ = (int32)uVar13;
          this->_oneof_case_[0] = 0x1e;
        }
        else {
          if (uVar8 == 0x28) {
            if (cVar12 != '@') goto LAB_003cdc9a;
            clear_value(this);
            puVar6 = input->buffer_;
            if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (long)(char)uVar3)) {
              input->buffer_ = puVar6 + 1;
              pVar16._8_8_ = 1;
              pVar16.first = (long)(char)uVar3;
            }
            else {
              pVar16 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
            }
            if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              (this->value_).longvalue_ = pVar16.first;
              this->_oneof_case_[0] = 0x28;
              goto LAB_003cdcc0;
            }
            goto LAB_003cdcc2;
          }
          if (uVar8 == 0x32) {
            if (cVar12 != -0x70) goto LAB_003cdc9a;
            clear_value(this);
            puVar6 = input->buffer_;
            if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (long)(char)uVar3)) {
              input->buffer_ = puVar6 + 1;
              pVar15._8_8_ = 1;
              pVar15.first = (long)(char)uVar3;
            }
            else {
              pVar15 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
            }
            if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
            goto LAB_003cdcc2;
            (this->value_).boolvalue_ = pVar15.first != 0;
            this->_oneof_case_[0] = 0x32;
          }
          else {
            if ((uVar8 != 10) || (cVar12 != 'Q')) goto LAB_003cdc9a;
            clear_value(this);
            puVar5 = (uint64 *)input->buffer_;
            if (*(int *)&input->buffer_end_ - (int)puVar5 < 8) {
              bVar7 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                                (input,&local_38);
              if (!bVar7) goto LAB_003cdcc2;
            }
            else {
              local_38 = *puVar5;
              input->buffer_ = (uint8 *)(puVar5 + 1);
            }
            *(uint64 *)&(this->value_).intvalue_ = local_38;
            this->_oneof_case_[0] = 10;
          }
        }
      }
LAB_003cdcc0:
      iVar11 = 0;
    }
LAB_003cdcc2:
    if (iVar11 != 0) {
      return iVar11 != 6;
    }
  } while( true );
}

Assistant:

bool CustomModel_CustomModelParamValue::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CustomModel.CustomModelParamValue)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // double doubleValue = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(81u)) {
          clear_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &value_.doublevalue_)));
          set_has_doublevalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string stringValue = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_stringvalue()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->stringvalue().data(), this->stringvalue().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CustomModel.CustomModelParamValue.stringValue"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 intValue = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(240u)) {
          clear_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &value_.intvalue_)));
          set_has_intvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 longValue = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(320u)) {
          clear_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &value_.longvalue_)));
          set_has_longvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool boolValue = 50;
      case 50: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(400u)) {
          clear_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &value_.boolvalue_)));
          set_has_boolvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bytes bytesValue = 60;
      case 60: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(482u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_bytesvalue()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CustomModel.CustomModelParamValue)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CustomModel.CustomModelParamValue)
  return false;
#undef DO_
}